

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O1

void __thiscall dtc::dtb::asm_writer::write_data(asm_writer *this,uint64_t v)

{
  if ((this->bytes_written & 7) != 0) {
    write_line(this,"\t.balign 8\n");
    this->bytes_written = (this->bytes_written & 0xfffffff8) + 8;
  }
  write_byte(this,(uint8_t)(v >> 0x38));
  write_byte(this,(uint8_t)(v >> 0x30));
  write_byte(this,(uint8_t)(v >> 0x28));
  write_byte(this,(uint8_t)(v >> 0x20));
  write_byte(this,(uint8_t)(v >> 0x18));
  write_byte(this,(uint8_t)(v >> 0x10));
  write_byte(this,(uint8_t)(v >> 8));
  write_byte(this,(uint8_t)v);
  this->bytes_written = this->bytes_written + 8;
  return;
}

Assistant:

void
asm_writer::write_data(uint64_t v)
{
	if (bytes_written % 8 != 0)
	{
		write_line("\t.balign 8\n");
		bytes_written += (8 - (bytes_written % 8));
	}
	write_byte((v >> 56) & 0xff);
	write_byte((v >> 48) & 0xff);
	write_byte((v >> 40) & 0xff);
	write_byte((v >> 32) & 0xff);
	write_byte((v >> 24) & 0xff);
	write_byte((v >> 16) & 0xff);
	write_byte((v >> 8) & 0xff);
	write_byte((v >> 0) & 0xff);
	bytes_written += 8;
}